

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscUtil.c
# Opt level: O3

Gia_Man_t * Gia_ManDropContained(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  lit *begin;
  int iVar3;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  Vec_Int_t *p_01;
  int *piVar4;
  sat_solver *s;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar5;
  int iVar6;
  long lVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  int iVar10;
  
  pAig = Gia_ManToAigSimple(p);
  p_00 = Cnf_Derive(pAig,p->vCos->nSize - p->nRegs);
  iVar1 = *p_00->pVarNums;
  if (iVar1 < 0) {
LAB_0059f3a7:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10b,"int Abc_Var2Lit(int, int)");
  }
  Aig_ManStop(pAig);
  iVar3 = p->nRegs;
  pVVar8 = p->vCos;
  uVar2 = pVVar8->nSize;
  uVar9 = (ulong)uVar2;
  iVar10 = uVar2 - iVar3;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar6 = iVar10;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  p_01->pArray = piVar4;
  if (iVar3 < (int)uVar2) {
    lVar7 = 0;
    do {
      if ((int)uVar9 <= lVar7) goto LAB_0059f388;
      iVar3 = pVVar8->pArray[lVar7];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0059f369;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_00->pVarNums[iVar3] < 0) goto LAB_0059f3a7;
      Vec_IntPush(p_01,p_00->pVarNums[iVar3] * 2 + 1);
      lVar7 = lVar7 + 1;
      pVVar8 = p->vCos;
      uVar9 = (ulong)pVVar8->nSize;
    } while (lVar7 < (long)(uVar9 - (long)p->nRegs));
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,p_00->nVars);
  lVar7 = 0;
  while (lVar7 < p_00->nClauses) {
    iVar3 = sat_solver_addclause(s,p_00->pClauses[lVar7],p_00->pClauses[lVar7 + 1]);
    lVar7 = lVar7 + 1;
    if (iVar3 == 0) {
      Cnf_DataFree(p_00);
LAB_0059f1c1:
      sat_solver_delete(s);
      if (p_01->pArray != (int *)0x0) {
        free(p_01->pArray);
      }
      free(p_01);
      return (Gia_Man_t *)0x0;
    }
  }
  Cnf_DataFree(p_00);
  iVar3 = sat_solver_simplify(s);
  if (iVar3 == 0) goto LAB_0059f1c1;
  iVar3 = p->nRegs;
  pVVar8 = p->vCos;
  uVar2 = pVVar8->nSize;
  uVar9 = (ulong)uVar2;
  iVar10 = uVar2 - iVar3;
  p_02 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar6 = iVar10;
  }
  p_02->nSize = 0;
  p_02->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  p_02->pArray = piVar4;
  if (iVar3 < (int)uVar2) {
    lVar7 = 0;
    do {
      if ((int)uVar9 <= lVar7) {
LAB_0059f388:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((pVVar8->pArray[lVar7] < 0) || (p->nObjs <= pVVar8->pArray[lVar7])) {
LAB_0059f369:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar3 = p_01->nSize;
      if (iVar3 <= lVar7) goto LAB_0059f388;
      begin = p_01->pArray;
      if (begin[lVar7] < 0) {
LAB_0059f3c6:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10e,"int Abc_LitNot(int)");
      }
      begin[lVar7] = begin[lVar7] ^ 1;
      iVar3 = sat_solver_solve(s,begin,begin + iVar3,0,0,0,0);
      if (begin[lVar7] < 0) goto LAB_0059f3c6;
      begin[lVar7] = begin[lVar7] ^ 1;
      if (iVar3 == -1) {
        begin[lVar7] = iVar1 * 2;
      }
      else {
        Vec_IntPush(p_02,(int)lVar7);
      }
      lVar7 = lVar7 + 1;
      pVVar8 = p->vCos;
      uVar9 = (ulong)pVVar8->nSize;
    } while (lVar7 < (long)(uVar9 - (long)p->nRegs));
  }
  sat_solver_delete(s);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  piVar4 = p_02->pArray;
  if (p_02->nSize != p->vCos->nSize - p->nRegs) {
    pGVar5 = Gia_ManDupCones(p,piVar4,p_02->nSize,0);
    if (piVar4 != (int *)0x0) {
      free(piVar4);
    }
    free(p_02);
    return pGVar5;
  }
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(p_02);
  pGVar5 = Gia_ManDup(p);
  return pGVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Gia_ManDropContained( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Aig_Man_t * pMan = Gia_ManToAigSimple( p );
    Cnf_Dat_t * pDat = Cnf_Derive( pMan, Gia_ManPoNum(p) );
    Gia_Obj_t * pObj;
    Vec_Int_t * vLits, * vKeep;
    sat_solver * pSat;
    int ConstLit = Abc_Var2Lit(pDat->pVarNums[0], 0);
    int i, status;//, Count = 0;
    Aig_ManStop( pMan );

    vLits = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        int iObj = Gia_ObjId( p, pObj );
        Vec_IntPush( vLits, Abc_Var2Lit(pDat->pVarNums[iObj], 1) );
    }

    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pDat->nVars );
    for ( i = 0; i < pDat->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pDat->pClauses[i], pDat->pClauses[i+1] ) )
        {
            Cnf_DataFree( pDat );
            sat_solver_delete( pSat );
            Vec_IntFree( vLits );
            return NULL;
        }
    }
    Cnf_DataFree( pDat );
    status = sat_solver_simplify( pSat );
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
        Vec_IntFree( vLits );
        return NULL;
    }

    // iterate over POs
    vKeep = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits,i)) );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits,i)) );
        if ( status == l_False )
            Vec_IntWriteEntry( vLits, i, ConstLit ); // const1 SAT var is always true
        else 
        {
            assert( status = l_True );
            Vec_IntPush( vKeep, i );
        }
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
    if ( Vec_IntSize(vKeep) == Gia_ManPoNum(p) )
    {
        Vec_IntFree( vKeep );
        return Gia_ManDup(p);
    }
    pNew = Gia_ManDupCones( p, Vec_IntArray(vKeep), Vec_IntSize(vKeep), 0 );
    Vec_IntFree( vKeep );
    return pNew;
}